

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<float>::Fill(TPZVec<float> *this,float *copy,int64_t from,int64_t numelem)

{
  float fVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  if (numelem < -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TPZVec::Fill",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"It\'s negative parameter numelem, then numelem = ",0x30);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::ostream::flush();
  }
  auVar5 = _DAT_014d2b10;
  auVar4 = _DAT_014d28c0;
  auVar3 = _DAT_014d28b0;
  lVar7 = 0;
  if (0 < from) {
    lVar7 = from;
  }
  lVar9 = this->fNElements;
  if (numelem < 0) {
    numelem = lVar9;
  }
  lVar10 = numelem + from;
  if (lVar9 <= numelem + from) {
    lVar10 = lVar9;
  }
  lVar9 = lVar10 - lVar7;
  if (lVar9 != 0 && lVar7 <= lVar10) {
    pfVar2 = this->fStore;
    fVar1 = *copy;
    lVar10 = lVar9 + -1;
    auVar11._8_4_ = (int)lVar10;
    auVar11._0_8_ = lVar10;
    auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_014d28c0;
    do {
      auVar13._8_4_ = (int)uVar8;
      auVar13._0_8_ = uVar8;
      auVar13._12_4_ = (int)(uVar8 >> 0x20);
      auVar14 = (auVar13 | auVar3) ^ auVar4;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        pfVar2[lVar7 + uVar8] = fVar1;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        pfVar2[lVar7 + uVar8 + 1] = fVar1;
      }
      auVar13 = (auVar13 | auVar5) ^ auVar4;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        pfVar2[lVar7 + uVar8 + 2] = fVar1;
        pfVar2[lVar7 + uVar8 + 3] = fVar1;
      }
      uVar8 = uVar8 + 4;
    } while ((lVar9 + 3U & 0xfffffffffffffffc) != uVar8);
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}